

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O2

void __thiscall
efsw::DirWatcherGeneric::handleAction
          (DirWatcherGeneric *this,string *filename,unsigned_long action,string *oldFilename)

{
  WatchID WVar1;
  FileWatchListener *pFVar2;
  string local_90 [32];
  string local_70;
  string local_50;
  
  WVar1 = (this->Watch->super_Watcher).ID;
  pFVar2 = (this->Watch->super_Watcher).Listener;
  std::__cxx11::string::string((string *)&local_50,(string *)filename);
  FileSystem::fileNameFromPath(&local_70,&local_50);
  std::__cxx11::string::string(local_90,(string *)oldFilename);
  (*pFVar2->_vptr_FileWatchListener[2])
            (pFVar2,WVar1,&this->DirSnap,&local_70,action & 0xffffffff,local_90);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void DirWatcherGeneric::handleAction( const std::string &filename, unsigned long action, std::string oldFilename)
{
	Watch->Listener->handleFileAction( Watch->ID, DirSnap.DirectoryInfo.Filepath, FileSystem::fileNameFromPath( filename ), (Action)action, oldFilename );
}